

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_draw_index * nk_draw_list_alloc_elements(nk_draw_list *list,nk_size count)

{
  nk_buffer *pnVar1;
  nk_draw_index *pnVar2;
  void *pvVar3;
  int *piVar4;
  nk_size nVar5;
  
  pnVar2 = (nk_draw_index *)nk_buffer_alloc(list->elements,NK_BUFFER_FRONT,count * 2,2);
  if (pnVar2 == (nk_draw_index *)0x0) {
    pnVar2 = (nk_draw_index *)0x0;
  }
  else {
    pnVar1 = list->buffer;
    if (pnVar1 == (nk_buffer *)0x0) {
      pvVar3 = (void *)0x0;
      nVar5 = 0;
    }
    else {
      pvVar3 = (pnVar1->memory).ptr;
      nVar5 = (pnVar1->memory).size;
    }
    list->element_count = list->element_count + (int)count;
    piVar4 = (int *)((long)pvVar3 +
                    (ulong)(list->cmd_count - 1) * -0x20 + (nVar5 - list->cmd_offset));
    *piVar4 = *piVar4 + (int)count;
  }
  return pnVar2;
}

Assistant:

NK_INTERN nk_draw_index*
nk_draw_list_alloc_elements(struct nk_draw_list *list, nk_size count)
{
nk_draw_index *ids;
struct nk_draw_command *cmd;
NK_STORAGE const nk_size elem_align = NK_ALIGNOF(nk_draw_index);
NK_STORAGE const nk_size elem_size = sizeof(nk_draw_index);
NK_ASSERT(list);
if (!list) return 0;

ids = (nk_draw_index*)
nk_buffer_alloc(list->elements, NK_BUFFER_FRONT, elem_size*count, elem_align);
if (!ids) return 0;
cmd = nk_draw_list_command_last(list);
list->element_count += (unsigned int)count;
cmd->elem_count += (unsigned int)count;
return ids;
}